

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mllr_io.c
# Opt level: O0

int32 free_mllr_reg(float32 *****regl,float32 ****regr,uint32 n_class,uint32 n_stream)

{
  uint local_28;
  uint local_24;
  uint32 j;
  uint32 i;
  uint32 n_stream_local;
  uint32 n_class_local;
  float32 ****regr_local;
  float32 *****regl_local;
  
  for (local_24 = 0; local_24 < n_class; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < n_stream; local_28 = local_28 + 1) {
      ckd_free_3d(regl[local_24][local_28]);
      ckd_free_2d(regr[local_24][local_28]);
    }
  }
  ckd_free_2d(regl);
  ckd_free_2d(regr);
  return 0;
}

Assistant:

int32
free_mllr_reg(float32 *****regl,
              float32 ****regr,
              uint32  n_class,
              uint32  n_stream)
{
    uint32 i,j;

    for (i=0; i < n_class; i++) {
        for (j=0; j < n_stream; j++) {
            ckd_free_3d((void ***)regl[i][j]);
            ckd_free_2d((void **)regr[i][j]);
        }
    }
    ckd_free_2d((void **)regl);
    ckd_free_2d((void **)regr);

    return S3_SUCCESS;
}